

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int parse_7zip_uint64(archive_read *a,uint64_t *val)

{
  byte bVar1;
  byte *pbVar2;
  int local_30;
  byte local_2a;
  int i;
  uchar mask;
  uchar avail;
  uchar *p;
  uint64_t *val_local;
  archive_read *a_local;
  
  pbVar2 = header_bytes(a,1);
  if (pbVar2 == (byte *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    bVar1 = *pbVar2;
    local_2a = 0x80;
    *val = 0;
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      if ((bVar1 & local_2a) == 0) {
        *val = (long)(int)(((uint)bVar1 & local_2a - 1) << ((byte)(local_30 << 3) & 0x1f)) + *val;
        break;
      }
      pbVar2 = header_bytes(a,1);
      if (pbVar2 == (byte *)0x0) {
        return -1;
      }
      *val = (ulong)*pbVar2 << ((byte)(local_30 << 3) & 0x3f) | *val;
      local_2a = (byte)((int)(uint)local_2a >> 1);
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
parse_7zip_uint64(struct archive_read *a, uint64_t *val)
{
	const unsigned char *p;
	unsigned char avail, mask;
	int i;

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	avail = *p;
	mask = 0x80;
	*val = 0;
	for (i = 0; i < 8; i++) {
		if (avail & mask) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			*val |= ((uint64_t)*p) << (8 * i);
			mask >>= 1;
			continue;
		}
		*val += (avail & (mask -1)) << (8 * i);
		break;
	}
	return (0);
}